

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_muladd_arm(float64 xa,float64 xb,float64 xc,int flags,float_status *s)

{
  union_float64 uVar1;
  union_float64 uVar2;
  float64 fVar3;
  bool bVar4;
  double dVar5;
  int local_170;
  int local_154;
  int local_13c;
  int local_128;
  int local_10c;
  int local_100;
  union_float64 uc_orig;
  union_float64 ua_orig;
  _Bool prod_sign;
  union_float64 up;
  union_float64 ur;
  union_float64 uc;
  union_float64 ub;
  union_float64 ua;
  float_status *s_local;
  float64 fStack_a8;
  int flags_local;
  float64 xc_local;
  float64 xb_local;
  float64 xa_local;
  float_status *local_88;
  float_status *local_80;
  union_float64 *local_78;
  union_float64 *local_70;
  union_float64 *local_68;
  union_float64 local_60;
  union_float64 local_58;
  union_float64 local_50;
  union_float64 local_48;
  union_float64 local_40;
  union_float64 local_18;
  
  bVar4 = false;
  if ((s->float_exception_flags & 0x20) != 0) {
    bVar4 = s->float_rounding_mode == '\0';
  }
  ur.s = xc;
  uc.s = xb;
  ub.s = xa;
  ua = (union_float64)s;
  s_local._4_4_ = flags;
  fStack_a8 = xc;
  xc_local = xb;
  xb_local = xa;
  local_88 = s;
  if ((!bVar4) || ((flags & 8U) != 0)) goto LAB_00597342;
  local_68 = &ub;
  local_70 = &uc;
  local_78 = &ur;
  local_80 = s;
  if (s->flush_inputs_to_zero != '\0') {
    float64_input_flush__nocheck(&local_68->s,s);
    float64_input_flush__nocheck(&local_70->s,local_80);
    float64_input_flush__nocheck(&local_78->s,local_80);
  }
  uVar2 = ub;
  uVar1 = ur;
  local_50 = ub;
  local_58 = uc;
  local_60 = ur;
  local_100 = 2;
  if (((ub.h != 0.0) || (NAN(ub.h))) && (local_100 = 0, !NAN(ub.h))) {
    dVar5 = ABS(ub.h);
    local_100 = 1;
    if (((dVar5 != INFINITY) || (NAN(dVar5))) && (local_100 = 3, 2.2250738585072014e-308 <= dVar5))
    {
      local_100 = 4;
    }
  }
  if (local_100 == 4) {
LAB_00596cad:
    local_128 = 2;
    if (((uc.h != 0.0) || (NAN(uc.h))) && (local_128 = 0, !NAN(uc.h))) {
      dVar5 = ABS(uc.h);
      local_128 = 1;
      if (((dVar5 != INFINITY) || (NAN(dVar5))) && (local_128 = 3, 2.2250738585072014e-308 <= dVar5)
         ) {
        local_128 = 4;
      }
    }
    if (local_128 != 4) {
      local_13c = 2;
      if (((uc.h != 0.0) || (NAN(uc.h))) && (local_13c = 0, !NAN(uc.h))) {
        dVar5 = ABS(uc.h);
        local_13c = 1;
        if (((dVar5 != INFINITY) || (NAN(dVar5))) &&
           (local_13c = 3, 2.2250738585072014e-308 <= dVar5)) {
          local_13c = 4;
        }
      }
      bVar4 = false;
      if (local_13c != 2) goto LAB_0059702c;
    }
    local_154 = 2;
    if (((ur.h != 0.0) || (NAN(ur.h))) && (local_154 = 0, !NAN(ur.h))) {
      dVar5 = ABS(ur.h);
      local_154 = 1;
      if (((dVar5 != INFINITY) || (NAN(dVar5))) && (local_154 = 3, 2.2250738585072014e-308 <= dVar5)
         ) {
        local_154 = 4;
      }
    }
    bVar4 = true;
    if (local_154 != 4) {
      local_170 = 2;
      if (((ur.h != 0.0) || (NAN(ur.h))) && (local_170 = 0, !NAN(ur.h))) {
        dVar5 = ABS(ur.h);
        local_170 = 1;
        if (((dVar5 != INFINITY) || (NAN(dVar5))) &&
           (local_170 = 3, 2.2250738585072014e-308 <= dVar5)) {
          local_170 = 4;
        }
      }
      bVar4 = local_170 == 2;
    }
  }
  else {
    local_10c = 2;
    if (((ub.h != 0.0) || (NAN(ub.h))) && (local_10c = 0, !NAN(ub.h))) {
      dVar5 = ABS(ub.h);
      local_10c = 1;
      if (((dVar5 != INFINITY) || (NAN(dVar5))) && (local_10c = 3, 2.2250738585072014e-308 <= dVar5)
         ) {
        local_10c = 4;
      }
    }
    bVar4 = false;
    if (local_10c == 2) goto LAB_00596cad;
  }
LAB_0059702c:
  ur = uVar1;
  ub = uVar2;
  if ((bVar4) && ((force_soft_fma & 1U) == 0)) {
    local_40 = ub;
    if (((ub.s & 0x7fffffffffffffff) == 0) || (local_48 = uc, (uc.s & 0x7fffffffffffffff) == 0)) {
      if ((s_local._4_4_ & 1) != 0) {
        ur.s = ur.s ^ 0x8000000000000000;
      }
      up.h = (double)((long)(int)(uint)((int)((uint)((ulong)ub >> 0x20) ^ (uint)((ulong)uc >> 0x20))
                                        < 0 != ((s_local._4_4_ & 2) != 0)) << 0x3f) + ur.h;
    }
    else {
      if ((s_local._4_4_ & 2) != 0) {
        ub.s = ub.s ^ 0x8000000000000000;
      }
      if ((s_local._4_4_ & 1) != 0) {
        ur.s = ur.s ^ 0x8000000000000000;
      }
      up.h = fma(ub.h,uc.h,ur.h);
      if (ABS(up.h) == INFINITY) {
        *(byte *)(ua.s + 2) = *(byte *)(ua.s + 2) | 8;
      }
      else {
        ur = uVar1;
        ub = uVar2;
        local_18.h = up.h;
        if (ABS(up.h) <= 1.1754943508222875e-38) goto LAB_00597342;
      }
    }
    if ((s_local._4_4_ & 4) != 0) {
      return up.s ^ 0x8000000000000000;
    }
    return up.s;
  }
LAB_00597342:
  fVar3 = soft_f64_muladd(ub.s,uc.s,ur.s,s_local._4_4_,ua.s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_muladd(float64 xa, float64 xb, float64 xc, int flags, float_status *s)
{
    union_float64 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float64_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f64_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float64_is_zero(ua.s) || float64_is_zero(ub.s)) {
        union_float64 up;
        bool prod_sign;

        prod_sign = float64_is_neg(ua.s) ^ float64_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float64_set_sign(float64_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float64 ua_orig = ua;
        union_float64 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fma(ua.h, ub.h, uc.h);

        if (unlikely(f64_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabs(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float64_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f64_muladd(ua.s, ub.s, uc.s, flags, s);
}